

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

double __thiscall spdlog::logger::log(logger *this,double __x)

{
  __int_type_conflict _Var1;
  int iVar2;
  pointer pcVar3;
  size_type sVar4;
  int in_ESI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  log_msg local_90;
  
  iVar2 = (this->level_).super___atomic_base<int>._M_i;
  _Var1 = (this->tracer_).enabled_._M_base._M_i;
  if ((in_ESI < iVar2 & (_Var1 ^ 1U)) == 0) {
    pcVar3 = (this->name_)._M_dataplus._M_p;
    sVar4 = (this->name_)._M_string_length;
    local_90.time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_90.logger_name.data_ = pcVar3;
    local_90.logger_name.size_ = sVar4;
    local_90.thread_id = details::os::thread_id();
    local_90.color_range_start = 0;
    local_90.color_range_end = 0;
    log_it_(this,&local_90,iVar2 <= in_ESI,(bool)(_Var1 & 1));
    __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  return __x;
}

Assistant:

void log(source_loc loc, level::level_enum lvl, string_view_t msg) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }

        details::log_msg log_msg(loc, name_, lvl, msg);
        log_it_(log_msg, log_enabled, traceback_enabled);
    }